

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O1

void ncnn::gridsample_2d_bilinear_apply_interpolation_p16
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined1 (*pauVar7) [64];
  int *offset_ptr;
  int *piVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  
  iVar1 = dst->c;
  if (0 < (long)iVar1) {
    iVar3 = dst->h * dst->w;
    lVar5 = 0;
    do {
      if (0 < iVar3) {
        lVar6 = src->cstep * lVar5 * src->elemsize;
        pvVar2 = src->data;
        piVar8 = (int *)offset_value->data;
        pauVar7 = (undefined1 (*) [64])(dst->cstep * lVar5 * dst->elemsize + (long)dst->data);
        iVar4 = iVar3;
        do {
          auVar10 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar11 = ZEXT1664(ZEXT816(0) << 0x40);
          if (-1 < (long)*piVar8) {
            auVar11 = *(undefined1 (*) [64])((long)pvVar2 + (long)*piVar8 * 4 + lVar6);
          }
          if (-1 < (long)piVar8[1]) {
            auVar10 = *(undefined1 (*) [64])((long)pvVar2 + (long)piVar8[1] * 4 + lVar6);
          }
          auVar13 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar12 = ZEXT1664(ZEXT816(0) << 0x40);
          if (-1 < (long)piVar8[2]) {
            auVar12 = *(undefined1 (*) [64])((long)pvVar2 + (long)piVar8[2] * 4 + lVar6);
          }
          if (-1 < (long)piVar8[3]) {
            auVar13 = *(undefined1 (*) [64])((long)pvVar2 + (long)piVar8[3] * 4 + lVar6);
          }
          auVar9 = vbroadcastss_avx512f(ZEXT416((uint)piVar8[4]));
          auVar11 = vfmsub231ps_avx512f(auVar11,auVar9,auVar11);
          auVar11 = vfmsub213ps_avx512f(auVar10,auVar9,auVar11);
          auVar10 = vfmsub231ps_avx512f(auVar12,auVar9,auVar12);
          auVar10 = vfnmadd231ps_avx512f(auVar10,auVar9,auVar13);
          auVar12 = vbroadcastss_avx512f(ZEXT416((uint)piVar8[5]));
          auVar11 = vfmsub231ps_avx512f(auVar11,auVar12,auVar11);
          auVar11 = vfnmsub231ps_avx512f(auVar11,auVar12,auVar10);
          *pauVar7 = auVar11;
          pauVar7 = pauVar7 + 1;
          piVar8 = piVar8 + 6;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return;
}

Assistant:

static void gridsample_2d_bilinear_apply_interpolation_p16(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 4;

            __m512 v00_val = offset_ptr[0] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[0]) : _mm512_set1_ps(0);
            __m512 v01_val = offset_ptr[1] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[1]) : _mm512_set1_ps(0);
            __m512 v10_val = offset_ptr[2] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[2]) : _mm512_set1_ps(0);
            __m512 v11_val = offset_ptr[3] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[3]) : _mm512_set1_ps(0);

            __m512 value1 = _mm512_set1_ps(value_ptr[0]);
            __m512 v0 = _mm512_fmadd_ps(v01_val, value1, _mm512_fnmadd_ps(v00_val, value1, v00_val));
            __m512 v1 = _mm512_fmadd_ps(v11_val, value1, _mm512_fnmadd_ps(v10_val, value1, v10_val));

            __m512 value2 = _mm512_set1_ps(value_ptr[1]);
            __m512 _v = _mm512_fmadd_ps(v1, value2, _mm512_fnmadd_ps(v0, value2, v0));
            _mm512_storeu_ps(dstptr, _v);

            dstptr += 16;
            offset_value_ptr += 6;
        }
    }
}